

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

BlockGraph * __thiscall GraphBuilder::findBlock(GraphBuilder *this,BasicBlock *basicBlock)

{
  iterator iVar1;
  BasicBlock *local_8;
  
  if ((basicBlock != (BasicBlock *)0x0) &&
     (local_8 = basicBlock,
     iVar1 = std::
             _Hashtable<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->llvmToBlockMap_)._M_h,&local_8),
     iVar1.super__Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false>.
     _M_cur != (__node_type *)0x0)) {
    return *(BlockGraph **)
            ((long)iVar1.
                   super__Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false>
                   ._M_cur + 0x10);
  }
  return (BlockGraph *)0x0;
}

Assistant:

BlockGraph *GraphBuilder::findBlock(const llvm::BasicBlock *basicBlock) {
    if (!basicBlock) {
        return nullptr;
    }
    auto iterator = this->llvmToBlockMap_.find(basicBlock);
    if (iterator == this->llvmToBlockMap_.end()) {
        return nullptr;
    }
    return iterator->second;
}